

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O3

void __thiscall xLearn::DMATRIX_TEST_CopyFrom_Test::TestBody(DMATRIX_TEST_CopyFrom_Test *this)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  bool bVar2;
  index_t row_id;
  long lVar3;
  char *pcVar4;
  pointer expected;
  AssertionResult gtest_ar;
  DMatrix new_matrix;
  DMatrix matrix;
  AssertHelper local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  internal local_120 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  AssertHelper local_110;
  undefined1 local_108 [48];
  pointer pfStack_d8;
  undefined1 auStack_d0 [16];
  pointer pfStack_c0;
  pointer pfStack_b8;
  unkbyte9 Stack_b0;
  index_t local_a4;
  undefined1 local_98 [48];
  pointer pfStack_68;
  undefined1 auStack_60 [16];
  pointer pfStack_50;
  pointer pfStack_48;
  unkbyte9 Stack_40;
  index_t local_34;
  
  local_34 = 0;
  local_98._0_8_ = 0;
  local_98._8_8_ = 0;
  local_98._16_4_ = 0;
  local_98._24_9_ = SUB649(ZEXT464(0) << 0x40,0);
  local_98._33_15_ = SUB6415(ZEXT464(0) << 0x40,0);
  pfStack_68 = (pointer)0x0;
  auStack_60 = (undefined1  [16])0x0;
  pfStack_50 = (pointer)0x0;
  pfStack_48 = (pointer)0x0;
  Stack_40._0_8_ = (pointer)0x0;
  Stack_40._8_1_ = false;
  DMatrix::Reset((DMatrix *)local_98);
  lVar3 = 0;
  do {
    DMatrix::AddRow((DMatrix *)local_98);
    row_id = (index_t)lVar3;
    DMatrix::AddNode((DMatrix *)local_98,row_id,row_id,2.5,row_id);
    pfStack_68[lVar3] = (float)lVar3;
    pfStack_50[lVar3] = 0.25;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  local_108._0_16_ = ZEXT416(0) << 0x20;
  local_a4 = 0;
  local_98._0_8_ = 0x4d2;
  local_108._16_4_ = 0;
  local_98._8_8_ = 0x162e;
  local_108._24_8_ = (pointer)0x0;
  local_108[0x20] = 0;
  local_108._45_3_ = 0;
  local_108._33_12_ = ZEXT412(0) << 0x20;
  pfStack_d8 = (pointer)0x0;
  auStack_d0 = (undefined1  [16])0x0;
  pfStack_c0 = (pointer)0x0;
  pfStack_b8 = (pointer)0x0;
  Stack_b0._0_8_ = (pointer)0x0;
  Stack_b0._8_1_ = false;
  DMatrix::CopyFrom((DMatrix *)local_108,(DMatrix *)local_98);
  DMatrix::Reset((DMatrix *)local_98);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_120,"new_matrix.row_length","kLength",(uint *)(local_108 + 0x10),&kLength);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (((local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_128.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_128.ptr_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_120,"new_matrix.hash_value_1","1234",(unsigned_long *)local_108,(int *)&local_128
            );
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (((local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_128.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_128.ptr_._0_4_ = 0x162e;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_120,"new_matrix.hash_value_2","5678",(unsigned_long *)(local_108 + 8),
             (int *)&local_128);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (((local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_128.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_128.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_120,"new_matrix.has_label","true",(bool *)((long)&Stack_b0 + 8),
             (bool *)&local_128);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (((local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_128.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_128.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    testing::internal::CmpHelperEQ<float,unsigned_long>
              (local_120,"new_matrix.Y[i]","i",pfStack_d8 + (long)local_128.ptr_,
               (unsigned_long *)&local_128);
    if (local_120[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      pcVar4 = "";
      if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0xa8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (((local_130.data_ != (AssertHelperData *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_130.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_130.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_130.data_ = (AssertHelperData *)&DAT_3fd0000000000000;
    testing::internal::CmpHelperEQ<float,double>
              (local_120,"new_matrix.norm[i]","0.25",pfStack_c0 + (long)local_128.ptr_,
               (double *)&local_130);
    if (local_120[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      pcVar4 = "";
      if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0xa9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (((local_130.data_ != (AssertHelperData *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_130.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_130.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar1 = *(pointer)(local_108._24_8_ + local_128.ptr_ * 8);
    expected = (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (expected !=
        (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  (local_120,"iter->field_id","i",&expected->field_id,(unsigned_long *)&local_128);
        if (local_120[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_130);
          pcVar4 = "";
          if (local_118.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0xad,pcVar4);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if (((local_130.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_130.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_130.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  (local_120,"iter->feat_id","i",&expected->feat_id,(unsigned_long *)&local_128);
        if (local_120[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_130);
          pcVar4 = "";
          if (local_118.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0xae,pcVar4);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if (((local_130.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_130.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_130.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_120,"iter->feat_val","2.5",expected->feat_val,2.5);
        if (local_120[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_130);
          pcVar4 = "";
          if (local_118.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((local_118.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0xaf,pcVar4);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if (((local_130.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_130.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_130.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        expected = expected + 1;
      } while (expected !=
               (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_128.ptr_ = local_128.ptr_ + 1;
  } while (local_128.ptr_ <
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa);
  DMatrix::~DMatrix((DMatrix *)local_108);
  DMatrix::~DMatrix((DMatrix *)local_98);
  return;
}

Assistant:

TEST(DMATRIX_TEST, CopyFrom) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Copy matrix
  DMatrix new_matrix;
  new_matrix.CopyFrom(&matrix);
  matrix.Reset();
  // Check
  EXPECT_EQ(new_matrix.row_length, kLength);
  EXPECT_EQ(new_matrix.hash_value_1, 1234);
  EXPECT_EQ(new_matrix.hash_value_2, 5678);
  EXPECT_EQ(new_matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(new_matrix.Y[i], i);
    EXPECT_EQ(new_matrix.norm[i], 0.25);
    SparseRow *row =new_matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
}